

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_MinimumFee_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *in_R9;
  Amount AVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  CoinSelectionOption option;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  bool *in_stack_fffffffffffffcf8;
  AssertionResult *in_stack_fffffffffffffd00;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd08;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  string local_270;
  AssertHelper local_250;
  Message local_248;
  byte local_239;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined8 local_218;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined8 local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  int64_t local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  int64_t local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  size_type local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140 [3];
  CoinSelectionOption *in_stack_fffffffffffffed8;
  UtxoFilter *in_stack_fffffffffffffee0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffee8;
  Amount *in_stack_fffffffffffffef0;
  CoinSelection *in_stack_fffffffffffffef8;
  pointer in_stack_ffffffffffffff10;
  Amount *in_stack_ffffffffffffff18;
  Amount *in_stack_ffffffffffffff20;
  bool *in_stack_ffffffffffffff28;
  undefined1 local_69 [17];
  int64_t local_58;
  undefined1 local_50;
  undefined1 local_48 [32];
  int64_t local_28;
  undefined1 local_20;
  int64_t local_18;
  undefined1 local_10;
  
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0x1befcb60);
  local_28 = AVar4.amount_;
  local_20 = AVar4.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount((Amount *)(local_48 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_48);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(1000);
  local_69._1_8_ = AVar4.amount_;
  local_69[9] = AVar4.ignore_check_;
  local_69[0] = 0;
  local_58 = local_69._1_8_;
  local_50 = local_69[9];
  GetBitcoinOption();
  cfd::CoinSelectionOption::SetKnapsackMinimumChange
            ((CoinSelectionOption *)&stack0xffffffffffffff28,0);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x2614d4);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      in_stack_fffffffffffffd10 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_69;
      in_stack_fffffffffffffd08 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_48;
      in_stack_fffffffffffffd00 = (AssertionResult *)(local_48 + 0x10);
      in_stack_fffffffffffffcf8 = (bool *)&local_58;
      in_R9 = &stack0xffffffffffffff28;
      cfd::CoinSelection::SelectCoins
                (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (Amount *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd10);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd10);
    }
  }
  else {
    testing::Message::Message(local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x12a,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, option, tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x2616b4);
  }
  local_160 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff00);
  local_164 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
             (unsigned_long *)in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2617a9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x26180c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x261864);
  local_190 = cfd::core::Amount::GetSatoshiValue((Amount *)(local_48 + 0x10));
  local_194 = 0x1bf08eb0;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
             (long *)in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x261926);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x12d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x261983);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2619db);
  local_1c0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_48);
  local_1c4 = 0xe10;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
             (long *)in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x261a9d);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x261afa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x261b52);
  sVar3 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff00);
  if (sVar3 == 2) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff00,0);
    local_1f0 = 0x12a05f20;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
               (unsigned_long *)in_stack_fffffffffffffd08,(long *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x261c1b);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x130,pcVar2);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x261c78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x261ccd);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff00,1);
    local_218 = 0x9502f90;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
               (unsigned_long *)in_stack_fffffffffffffd08,(long *)in_stack_fffffffffffffd00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x261d80);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x131,pcVar2);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x261ddd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x261e32);
  }
  local_239 = ~local_69[0] & 1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(type *)0x261e71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)&local_238,(AssertionResult *)"use_bnb","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x133,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    testing::Message::~Message((Message *)0x261f57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x261fcf);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd10);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x261fe9);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_MinimumFee)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(468700000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1000);
  bool use_bnb = false;
  CoinSelectionOption option = GetBitcoinOption();
  option.SetKnapsackMinimumChange(0);  // minimum change is BnB level
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, option,
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 2);
  EXPECT_EQ(select_value.GetSatoshiValue(), 468750000);
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(312500000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(156250000));
  }
  EXPECT_FALSE(use_bnb);
}